

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool_test.cpp
# Opt level: O2

void SayHelloWorld(void)

{
  ostream *poVar1;
  LockGuard lock;
  LockGuard local_10;
  
  usleep(1000);
  LockGuard::LockGuard(&local_10,&mutex);
  pthread_self();
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  poVar1 = std::operator<<(poVar1,", Hello World");
  std::endl<char,std::char_traits<char>>(poVar1);
  globalCnt = globalCnt + 1;
  LockGuard::~LockGuard(&local_10);
  return;
}

Assistant:

void SayHelloWorld()
{
	usleep(1000);
	LockGuard lock(mutex);
	cout << (unsigned int)pthread_self() << ", Hello World" << endl;
	++globalCnt;
}